

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O2

_Bool nni_aio_sys_drain(void)

{
  nni_aio_expire_q *mtx;
  int iVar1;
  byte bVar2;
  _Bool _Var3;
  long lVar4;
  
  _Var3 = false;
  iVar1 = nni_aio_expire_q_cnt;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    mtx = nni_aio_expire_q_list[lVar4];
    if (mtx != (nni_aio_expire_q *)0x0) {
      nni_mtx_lock(&mtx->eq_mtx);
      mtx->eq_stop = true;
      nni_cv_wake(&mtx->eq_cv);
      bVar2 = 0;
      while( true ) {
        iVar1 = nni_list_empty(&mtx->eq_list);
        if (iVar1 != 0) break;
        nni_cv_wait(&mtx->eq_cv);
        bVar2 = 1;
      }
      nni_mtx_unlock(&mtx->eq_mtx);
      _Var3 = (_Bool)(bVar2 | _Var3);
      iVar1 = nni_aio_expire_q_cnt;
    }
  }
  return _Var3;
}

Assistant:

bool
nni_aio_sys_drain(void)
{
	bool result = false;
	for (int i = 0; i < nni_aio_expire_q_cnt; i++) {
		if (nni_aio_expire_q_stop(nni_aio_expire_q_list[i])) {
			result = true;
		}
	}
	return (result);
}